

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O2

Fraig_Node_t * Fraig_NodeCreatePi(Fraig_Man_t *p)

{
  Fraig_NodeVec_t *pFVar1;
  uint uVar2;
  int iVar3;
  Fraig_Node_t *Entry;
  uint *puVar4;
  abctime aVar5;
  abctime aVar6;
  Fraig_Node_t *pFVar7;
  long lVar8;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  puVar4 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = puVar4;
  iVar3 = p->nWordsRand;
  Entry->puSimD = puVar4 + iVar3;
  memset(puVar4 + iVar3,0,(long)p->nWordsDyna << 2);
  pFVar1 = p->vNodes;
  Entry->Num = pFVar1->nSize;
  Fraig_NodeVecPush(pFVar1,Entry);
  pFVar1 = p->vInputs;
  Entry->NumPi = pFVar1->nSize;
  Fraig_NodeVecPush(pFVar1,Entry);
  Entry->Level = 0;
  Entry->nRefs = 1;
  Entry->field_0x18 = Entry->field_0x18 & 0xfe;
  aVar5 = Abc_Clock();
  Entry->uHashR = 0;
  for (lVar8 = 0; lVar8 < p->nWordsRand; lVar8 = lVar8 + 1) {
    uVar2 = Aig_ManRandom(0);
    uVar2 = uVar2 << (lVar8 == 0);
    Entry->puSimR[lVar8] = uVar2;
    Entry->uHashR = Entry->uHashR ^ uVar2 * s_FraigPrimes[lVar8];
  }
  iVar3 = Fraig_BitStringCountOnes(Entry->puSimR,p->nWordsRand);
  *(uint *)&Entry->field_0x18 = *(uint *)&Entry->field_0x18 & 0xfff | iVar3 << 0xc;
  Entry->uHashD = 0;
  for (lVar8 = 0; lVar8 < p->iWordStart; lVar8 = lVar8 + 1) {
    uVar2 = Aig_ManRandom(0);
    Entry->puSimD[lVar8] = uVar2;
    Entry->uHashD = Entry->uHashD ^ uVar2 * s_FraigPrimes[lVar8];
  }
  aVar6 = Abc_Clock();
  p->timeSims = p->timeSims + (aVar6 - aVar5);
  pFVar7 = Fraig_HashTableLookupF(p,Entry);
  if (pFVar7 == (Fraig_Node_t *)0x0) {
    return Entry;
  }
  __assert_fail("pNodeRes == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigNode.c"
                ,0x8f,"Fraig_Node_t *Fraig_NodeCreatePi(Fraig_Man_t *)");
}

Assistant:

Fraig_Node_t * Fraig_NodeCreatePi( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode, * pNodeRes;
    int i;
    abctime clk;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    memset( pNode->puSimD, 0, sizeof(unsigned) * p->nWordsDyna );

    // assign the number and add to the array of nodes
    pNode->Num   = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );

    // assign the PI number and add to the array of primary inputs
    pNode->NumPi = p->vInputs->nSize;   
    Fraig_NodeVecPush( p->vInputs, pNode );

    pNode->Level =  0;  // PI has 0 level
    pNode->nRefs =  1;  // it is a persistent node, which comes referenced
    pNode->fInv  =  0;  // the simulation info of the PI is not complemented

    // derive the simulation info for the new node
clk = Abc_Clock();
    // set the random simulation info for the primary input
    pNode->uHashR = 0;
    for ( i = 0; i < p->nWordsRand; i++ )
    {
        // generate the simulation info
        pNode->puSimR[i] = FRAIG_RANDOM_UNSIGNED;
        // for reasons that take very long to explain, it makes sense to have (0000000...) 
        // pattern in the set (this helps if we need to return the counter-examples)
        if ( i == 0 )
            pNode->puSimR[i] <<= 1;
        // compute the hash key
        pNode->uHashR ^= pNode->puSimR[i] * s_FraigPrimes[i];
    }
    // count the number of ones in the simulation vector
    pNode->nOnes = Fraig_BitStringCountOnes( pNode->puSimR, p->nWordsRand );

    // set the systematic simulation info for the primary input
    pNode->uHashD = 0;
    for ( i = 0; i < p->iWordStart; i++ )
    {
        // generate the simulation info
        pNode->puSimD[i] = FRAIG_RANDOM_UNSIGNED;
        // compute the hash key
        pNode->uHashD ^= pNode->puSimD[i] * s_FraigPrimes[i];
    }
p->timeSims += Abc_Clock() - clk;

    // insert it into the hash table
    pNodeRes = Fraig_HashTableLookupF( p, pNode );
    assert( pNodeRes == NULL );
    // add to the runtime of simulation
    return pNode;
}